

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O0

void sGenXtrue(int n,int nrhs,float *x,int ldx)

{
  int local_24;
  int local_20;
  int j;
  int i;
  int ldx_local;
  float *x_local;
  int nrhs_local;
  int n_local;
  
  for (local_24 = 0; local_24 < nrhs; local_24 = local_24 + 1) {
    for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
      x[local_20 + local_24 * ldx] = 1.0;
    }
  }
  return;
}

Assistant:

void
sGenXtrue(int n, int nrhs, float *x, int ldx)
{
    int  i, j;
    for (j = 0; j < nrhs; ++j)
	for (i = 0; i < n; ++i) {
	    x[i + j*ldx] = 1.0;/* + (float)(i+1.)/n;*/
	}
}